

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

char * svariable(char *name,char *cur,char **storage,identfun fun,int flags)

{
  size_t sVar1;
  char *__dest;
  ident local_68;
  ident *local_28;
  
  local_68.type = 2;
  local_68.name = name;
  local_68.field_4 = (anon_union_8_3_558327c1_for_ident_6)storage;
  local_68.fun = fun;
  local_68.flags = flags;
  if (initedidents == '\0') {
    if (identinits == (vector<ident> *)0x0) {
      identinits = (vector<ident> *)operator_new(0x10);
      identinits->buf = (ident *)0x0;
      identinits->alen = 0;
      identinits->ulen = 0;
    }
    vector<ident>::add(identinits,&local_68);
  }
  else {
    local_28 = hashset<ident>::access<char_const*,ident>(&idents,&local_68.name,&local_68);
    local_28->index = identmap.ulen;
    vector<ident_*>::add(&identmap,&local_28);
  }
  sVar1 = strlen(cur);
  __dest = (char *)operator_new__(sVar1 + 1);
  strncpy(__dest,cur,sVar1 + 1);
  __dest[sVar1] = '\0';
  return __dest;
}

Assistant:

char *svariable(const char *name, const char *cur, char **storage, identfun fun, int flags)
{
    addident(ident(ID_SVAR, name, storage, (void *)fun, flags));
    return newstring(cur);
}